

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_1::WatWriter::WriteExprList(WatWriter *this,ExprList *exprs)

{
  Delegate local_78;
  ExprVisitorDelegate delegate;
  ExprVisitor visitor;
  
  local_78._vptr_Delegate = (_func_int **)&PTR__Delegate_0155e1a8;
  delegate.super_Delegate._vptr_Delegate = (_func_int **)this;
  ExprVisitor::ExprVisitor((ExprVisitor *)&delegate.writer_,&local_78);
  ExprVisitor::VisitExprList((ExprVisitor *)&delegate.writer_,exprs);
  if (visitor.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(visitor.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (visitor.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(visitor.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (visitor.delegate_ != (Delegate *)0x0) {
    operator_delete(visitor.delegate_);
  }
  return;
}

Assistant:

void WatWriter::WriteExprList(const ExprList& exprs) {
  WABT_TRACE(WriteExprList);
  ExprVisitorDelegate delegate(this);
  ExprVisitor visitor(&delegate);
  visitor.VisitExprList(const_cast<ExprList&>(exprs));
}